

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterReader.cpp
# Opt level: O0

long __thiscall ParameterReader::_find(ParameterReader *this,string *name)

{
  int iVar1;
  ulong uVar2;
  size_type sVar3;
  const_reference pvVar4;
  string *in_RSI;
  string *in_RDI;
  uint ii;
  string local_80 [32];
  string local_60 [8];
  string *in_stack_ffffffffffffffa8;
  string local_40 [36];
  uint local_1c;
  
  local_1c = 0;
  while( true ) {
    uVar2 = (ulong)local_1c;
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_RDI);
    if (sVar3 <= uVar2) {
      return -1;
    }
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_RDI,(ulong)local_1c);
    std::__cxx11::string::string(local_80,in_RSI);
    AfterburnerUtil::trim(in_stack_ffffffffffffffa8);
    AfterburnerUtil::toLower(in_RDI);
    iVar1 = std::__cxx11::string::compare((string *)pvVar4);
    std::__cxx11::string::~string(local_40);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_80);
    if (iVar1 == 0) break;
    local_1c = local_1c + 1;
  }
  return (ulong)local_1c;
}

Assistant:

long ParameterReader::_find(string name) const {
    /*
      Check if the parameter with "name" already exists in the internal
      "names" list. If yes, it returns its
    */
    for (unsigned int ii = 0; ii < names.size(); ii++) {
        if (names[ii].compare(toLower(trim(name))) == 0) {
            return ii;
        }
    }
    return -1;
}